

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

void __thiscall wasm::SExpressionWasmBuilder::parseData(SExpressionWasmBuilder *this,Element *s)

{
  pointer *ppNVar1;
  bool bVar2;
  int iVar3;
  iterator __position;
  unkbyte9 Var4;
  bool bVar5;
  Element *pEVar6;
  Expression *init;
  bool bVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  undefined1 isPassive;
  uint i;
  IString str;
  IString str_00;
  Name NVar8;
  Name name;
  char *local_58;
  string_view local_48;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  SExpressionWasmBuilder *this_00;
  
  iVar3 = this->dataCounter;
  this->dataCounter = iVar3 + 1;
  local_48 = (string_view)Name::fromInt((long)iVar3);
  i = 1;
  pEVar6 = Element::operator[](s,1);
  if (pEVar6->isList_ == false) {
    i = 1;
    pEVar6 = Element::operator[](s,1);
    bVar7 = false;
    if ((pEVar6->isList_ == false) && ((pEVar6->dollared_ & 1U) != 0)) {
      pEVar6 = Element::operator[](s,1);
      local_48 = (string_view)Element::str(pEVar6);
      i = 2;
      bVar7 = true;
    }
  }
  else {
    bVar7 = false;
  }
  __position._M_current =
       (this->dataSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->dataSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->dataSegmentNames,__position,
               (Name *)&local_48);
  }
  else {
    ((__position._M_current)->super_IString).str._M_len = local_48._M_len;
    ((__position._M_current)->super_IString).str._M_str = local_48._M_str;
    ppNVar1 = &(this->dataSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pEVar6 = Element::operator[](s,i);
  bVar2 = pEVar6->isList_;
  isPassive = false;
  if (bVar2 == true) {
    pEVar6 = Element::operator[](s,i);
    str.str._M_str = extraout_RDX;
    str.str._M_len = DAT_00da7eb0;
    bVar5 = elementStartsWith(pEVar6,str);
    if (bVar5) {
      pEVar6 = Element::operator[](s,i);
      pEVar6 = Element::operator[](pEVar6,1);
      NVar8 = getMemoryName(this,pEVar6);
      Var4 = NVar8.super_IString.str._0_9_;
      i = i + 1;
    }
    else {
      NVar8 = getMemoryNameAtIdx(this,0);
      Var4 = NVar8.super_IString.str._0_9_;
    }
    local_58 = (char *)Var4;
    pEVar6 = Element::operator[](s,i);
    str_00.str._M_str = extraout_RDX_00;
    str_00.str._M_len = _ZN4wasmL6OFFSETE_1;
    bVar5 = elementStartsWith(pEVar6,str_00);
    if (bVar5) {
      pEVar6 = Element::operator[](pEVar6,1);
    }
    i = i + 1;
    init = parseExpression(this,pEVar6);
    isPassive = (undefined1)((unkuint9)Var4 >> 0x40);
  }
  else {
    local_58 = (char *)0x0;
    init = (Expression *)0x0;
  }
  NVar8.super_IString.str._M_str = local_58;
  NVar8.super_IString.str._M_len = (size_t)local_48._M_str;
  name.super_IString.str._M_str = (char *)local_48._M_len;
  name.super_IString.str._M_len = (size_t)&stack0xffffffffffffffc8;
  this_00 = (SExpressionWasmBuilder *)&stack0xffffffffffffffc8;
  Builder::makeDataSegment
            (name,NVar8,(bool)isPassive,(Expression *)(ulong)(bVar2 ^ 1),(char *)init,
             (Address)0xbd4a1c);
  *(bool *)((long)local_38._M_head_impl + 0x10) = bVar7;
  parseInnerData(this_00,s,i,
                 (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                 &stack0xffffffffffffffc8);
  Module::addDataSegment
            (this->wasm,
             (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
             &stack0xffffffffffffffc8);
  if (local_38._M_head_impl != (DataSegment *)0x0) {
    std::default_delete<wasm::DataSegment>::operator()
              ((default_delete<wasm::DataSegment> *)&stack0xffffffffffffffc8,local_38._M_head_impl);
  }
  return;
}

Assistant:

void SExpressionWasmBuilder::parseData(Element& s) {
  Index i = 1;
  Name name = Name::fromInt(dataCounter++);
  bool hasExplicitName = false;
  Name memory;
  bool isPassive = true;
  Expression* offset = nullptr;

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  dataSegmentNames.push_back(name);

  if (s[i]->isList()) {
    // Optional (memory <memoryidx>)
    if (elementStartsWith(s[i], MEMORY)) {
      auto& inner = *s[i++];
      memory = getMemoryName(*inner[1]);
    } else {
      memory = getMemoryNameAtIdx(0);
    }
    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      offset = parseExpression(inner[1]);
    } else {
      offset = parseExpression(inner);
    }
    isPassive = false;
  }

  auto seg = Builder::makeDataSegment(name, memory, isPassive, offset);
  seg->hasExplicitName = hasExplicitName;
  parseInnerData(s, i, seg);
  wasm.addDataSegment(std::move(seg));
}